

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::texstorage3d_invalid_levels
               (NegativeTestContext *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  allocator<char> local_59;
  deUint32 textures [2];
  string local_50;
  
  textures[0] = 0x1234;
  textures[1] = 0x1234;
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,textures[0]);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_INVALID_VALUE is generated if levels is less than 1.",&local_59
            );
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,0,0x8058,4,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,0,0x8058,0,0,0);
  NegativeTestContext::expectError(ctx,0x501);
  if (bVar1) {
LAB_00547993:
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,textures[1]);
    glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,0,0x8058,4,4,6);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,0,0x8058,0,0,6);
    NegativeTestContext::expectError(ctx,0x501);
  }
  else {
    bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (bVar2) goto LAB_00547993;
  }
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1"
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,8,2,2);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,2,8,2);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,2,2,8);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,8,8,8);
  NegativeTestContext::expectError(ctx,0x502);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_00547b5c;
  }
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,5,0x8058,2,2,6);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,5,0x8058,8,8,6);
  NegativeTestContext::expectError(ctx,0x502);
LAB_00547b5c:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void texstorage3d_invalid_levels (NegativeTestContext& ctx)
{
	deUint32	textures[]		= {0x1234, 0x1234};
	deUint32	log2MaxSize		= deLog2Floor32(8) + 1 + 1;
	const bool	supportsES32	= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	ctx.glGenTextures(2, textures);
	ctx.glBindTexture(GL_TEXTURE_3D, textures[0]);

	ctx.beginSection("GL_INVALID_VALUE is generated if levels is less than 1.");
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 4, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[1]);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 4, 4, 6);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 0, 0, 6);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1");
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 2, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 8, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 2, 8);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 8, 8);
	ctx.expectError		(GL_INVALID_OPERATION);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 2, 2, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 8, 8, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(2, textures);
}